

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O0

void __thiscall Clone_component_Test::~Clone_component_Test(Clone_component_Test *this)

{
  Clone_component_Test *this_local;
  
  ~Clone_component_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Clone, component)
{
    auto c = libcellml::Component::create();
    c->setId("unique");
    c->setName("copy");
    c->setMath(NON_EMPTY_MATH);

    auto cClone = c->clone();

    compareComponent(c, cClone);

    cClone->setName("on_my_own");
    EXPECT_NE(c->name(), cClone->name());
}